

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

int stream_obq_push(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  uint64_t uVar1;
  int iVar2;
  ulong uVar3;
  nghttp2_stream *pnVar4;
  
  if (dep_stream != (nghttp2_stream *)0x0) {
    do {
      pnVar4 = dep_stream;
      if (stream->queued != '\0') {
        return 0;
      }
      uVar3 = (ulong)stream->pending_penalty + stream->last_writelen * 0x100;
      stream->cycle = uVar3 / (uint)stream->weight + pnVar4->descendant_last_cycle;
      stream->pending_penalty = (uint32_t)(uVar3 % (ulong)(uint)stream->weight);
      uVar1 = pnVar4->descendant_next_seq;
      pnVar4->descendant_next_seq = uVar1 + 1;
      stream->seq = uVar1;
      iVar2 = nghttp2_pq_push(&pnVar4->obq,&stream->pq_entry);
      if (iVar2 != 0) {
        return iVar2;
      }
      stream->queued = '\x01';
      dep_stream = pnVar4->dep_prev;
      stream = pnVar4;
    } while (pnVar4->dep_prev != (nghttp2_stream *)0x0);
  }
  return 0;
}

Assistant:

static int stream_obq_push(nghttp2_stream *dep_stream, nghttp2_stream *stream) {
  int rv;

  for (; dep_stream && !stream->queued;
       stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    stream_next_cycle(stream, dep_stream->descendant_last_cycle);
    stream->seq = dep_stream->descendant_next_seq++;

    DEBUGF("stream: stream=%d obq push cycle=%lu\n", stream->stream_id,
           stream->cycle);

    DEBUGF("stream: push stream %d to stream %d\n", stream->stream_id,
           dep_stream->stream_id);

    rv = nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);
    if (rv != 0) {
      return rv;
    }
    stream->queued = 1;
  }

  return 0;
}